

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O0

void mp::WriteJSON<mp::QuadAndLinTerms,mp::AlgConRhs<_2>>
               (JSONW *jw,AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_> *algc)

{
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_2>_> *in_RSI;
  char *in_RDI;
  AlgConRhs<_2> acrhs;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> *this;
  JSONW *in_stack_ffffffffffffffa0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffffb8;
  string_view in_stack_ffffffffffffffc0;
  QuadAndLinTerms *in_stack_ffffffffffffffd8;
  JSONW *in_stack_ffffffffffffffe0;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff90,in_RDI);
  this = (basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-2>_>::GetBody(in_RSI);
  WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,mp::QuadAndLinTerms>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x2849eb);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this,in_RDI);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
  acrhs = AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-2>_>::GetRhsOrRange(in_RSI);
  WriteJSON<_2>(in_stack_ffffffffffffffa0,(AlgConRhs<_2> *)acrhs.rhs_);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x284a45);
  return;
}

Assistant:

inline void WriteJSON(JSONW jw,
                      const AlgebraicConstraint<Body, RhsOrRange>& algc) {
  WriteJSON(jw["body"], algc.GetBody());
  WriteJSON(jw["rhs_or_range"], algc.GetRhsOrRange());
}